

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Operation<short,duckdb::string_t,duckdb::ArgMinMaxState<short,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<short,_duckdb::string_t> *state,short *x,string_t *y,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  AggregateBinaryInput *in_R9;
  string_t y_data;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    y_data.value.pointer.ptr = (char *)binary;
    y_data.value._0_8_ = (y->value).pointer.ptr;
    Execute<short,duckdb::string_t,duckdb::ArgMinMaxState<short,duckdb::string_t>>
              ((ArgMinMaxBase<duckdb::LessThan,false> *)state,
               (ArgMinMaxState<short,_duckdb::string_t> *)(ulong)(uint)(int)*x,
               (short)*(undefined8 *)&y->value,y_data,in_R9);
    return;
  }
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (&binary->right_mask->super_TemplatedValidityMask<unsigned_long>,binary->ridx);
  if (bVar1) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&binary->left_mask->super_TemplatedValidityMask<unsigned_long>,binary->lidx);
    Assign<short,duckdb::string_t,duckdb::ArgMinMaxState<short,duckdb::string_t>>(state,x,y,!bVar1);
    (state->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}